

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue_basic_tests.cpp
# Opt level: O1

void density_tests::
     heterogeneous_queue_basic_void_tests<density::heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>>>
               (void)

{
  ControlBlock *pCVar1;
  ControlBlock *pCVar2;
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  queue;
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  local_60;
  iterator local_28;
  
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::heter_queue(&local_60);
  pCVar2 = local_60.m_head;
  do {
    pCVar1 = pCVar2;
    if (pCVar1 == local_60.m_tail) goto LAB_00e27270;
    pCVar2 = (ControlBlock *)(pCVar1->m_next & 0xfffffffffffffff8);
  } while ((pCVar1->m_next & 3) != 0);
  if (pCVar1 != local_60.m_tail) {
    detail::assert_failed<>
              ("queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0x4f);
  }
LAB_00e27270:
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::begin(&local_28,&local_60);
  if (CONCAT44(local_28.m_control._4_4_,local_28.m_control._0_4_) != 0) {
    detail::assert_failed<>
              ("queue.begin() == queue.end()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0x50);
  }
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::cbegin((const_iterator *)&local_28,&local_60);
  if (CONCAT44(local_28.m_control._4_4_,local_28.m_control._0_4_) != 0) {
    detail::assert_failed<>
              ("queue.cbegin() == queue.cend()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0x51);
  }
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::~heter_queue(&local_60);
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::heter_queue(&local_60);
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::clear(&local_60);
  local_28.m_control._0_4_ = 1;
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>>
  ::emplace<int,int>((heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>>
                      *)&local_60,(int *)&local_28);
  pCVar2 = local_60.m_head;
  do {
    pCVar1 = pCVar2;
    if (pCVar1 == local_60.m_tail) goto LAB_00e2732d;
    pCVar2 = (ControlBlock *)(pCVar1->m_next & 0xfffffffffffffff8);
  } while ((pCVar1->m_next & 3) != 0);
  if (pCVar1 == local_60.m_tail) {
LAB_00e2732d:
    detail::assert_failed<>
              ("!queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0x59);
  }
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::begin(&local_28,&local_60);
  if (CONCAT44(local_28.m_control._4_4_,local_28.m_control._0_4_) == 0) {
    detail::assert_failed<>
              ("queue.begin() != queue.end()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0x5a);
  }
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::cbegin((const_iterator *)&local_28,&local_60);
  if (CONCAT44(local_28.m_control._4_4_,local_28.m_control._0_4_) == 0) {
    detail::assert_failed<>
              ("queue.cbegin() != queue.cend()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0x5b);
  }
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::clear(&local_60);
  do {
    pCVar2 = local_60.m_head;
    if (pCVar2 == local_60.m_tail) goto LAB_00e273f3;
    local_60.m_head = (ControlBlock *)(pCVar2->m_next & 0xfffffffffffffff8);
  } while ((pCVar2->m_next & 3) != 0);
  if (pCVar2 != local_60.m_tail) {
    detail::assert_failed<>
              ("queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0x5e);
  }
LAB_00e273f3:
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::begin(&local_28,&local_60);
  if (CONCAT44(local_28.m_control._4_4_,local_28.m_control._0_4_) != 0) {
    detail::assert_failed<>
              ("queue.begin() == queue.end()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0x5f);
  }
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::cbegin((const_iterator *)&local_28,&local_60);
  if (CONCAT44(local_28.m_control._4_4_,local_28.m_control._0_4_) != 0) {
    detail::assert_failed<>
              ("queue.cbegin() == queue.cend()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/heterogeneous_queue_basic_tests.cpp"
               ,0x60);
  }
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::clear(&local_60);
  density::
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
  ::~heter_queue(&local_60);
  return;
}

Assistant:

void heterogeneous_queue_basic_void_tests()
    {
        {
            QUEUE queue;
            DENSITY_TEST_ASSERT(queue.empty());
            DENSITY_TEST_ASSERT(queue.begin() == queue.end());
            DENSITY_TEST_ASSERT(queue.cbegin() == queue.cend());
        }

        {
            QUEUE queue;
            queue.clear();

            queue.push(1);
            DENSITY_TEST_ASSERT(!queue.empty());
            DENSITY_TEST_ASSERT(queue.begin() != queue.end());
            DENSITY_TEST_ASSERT(queue.cbegin() != queue.cend());

            queue.clear();
            DENSITY_TEST_ASSERT(queue.empty());
            DENSITY_TEST_ASSERT(queue.begin() == queue.end());
            DENSITY_TEST_ASSERT(queue.cbegin() == queue.cend());
            queue.clear();
        }
    }